

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O2

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  MatrixXd *pMVar1;
  VectorXd *pVVar2;
  Matrix<double,__1,__1,_0,__1,__1> *__ptr;
  double *__ptr_00;
  DenseIndex DVar3;
  DenseIndex DVar4;
  double *__tmp;
  Scalar *pSVar5;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar6;
  double *pdVar7;
  CoeffReturnType pdVar8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar9;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  float fVar10;
  float fVar11;
  float fVar12;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_d0;
  Scalar local_b0;
  Scalar local_a8;
  double local_a0;
  double local_98;
  Scalar local_90;
  double local_88;
  Scalar local_80;
  Scalar local_78;
  double local_70;
  Scalar local_68;
  double local_60;
  double local_58;
  Scalar local_50;
  double local_48;
  Scalar local_40;
  Scalar local_38;
  
  if (this->is_initialized_ != false) {
    fVar11 = (float)((double)(measurement_pack->timestamp_ - this->previous_timestamp_) / 1000000.0)
    ;
    this->previous_timestamp_ = measurement_pack->timestamp_;
    fVar10 = fVar11 * fVar11;
    local_a0 = (double)fVar11;
    pMVar1 = &(this->ekf_).F_;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)pMVar1,0,2);
    *pSVar5 = local_a0;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)pMVar1,1,3);
    *pSVar5 = local_a0;
    local_a8 = (Scalar)CONCAT44(local_a8._4_4_,4);
    local_b0 = (Scalar)CONCAT44(local_b0._4_4_,4);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,(int *)&local_a8,(int *)&local_b0);
    __ptr = (Matrix<double,__1,__1,_0,__1,__1> *)
            (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_d0.m_xpr;
    DVar3 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    DVar4 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_d0.m_row;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_d0.m_col;
    local_d0.m_xpr = __ptr;
    local_d0.m_row = DVar3;
    local_d0.m_col = DVar4;
    free(__ptr);
    fVar12 = fVar11 * fVar10 * fVar11 * 0.25;
    local_d0.m_row = 0;
    local_d0.m_col = 1;
    local_d0.m_currentBlockRows = 1;
    *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = (double)(this->noise_ax * fVar12);
    local_a8 = 0.0;
    local_d0.m_xpr = &(this->ekf_).Q_;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_d0,&local_a8);
    fVar11 = fVar10 * fVar11 * 0.5;
    local_b0 = (Scalar)(this->noise_ax * fVar11);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_b0);
    local_38 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_38);
    local_40 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_40);
    local_48 = (double)(fVar12 * this->noise_ay);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_48);
    local_50 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_50);
    local_58 = (double)(this->noise_ay * fVar11);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_58);
    local_60 = (double)(this->noise_ax * fVar11);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_60);
    local_68 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_68);
    local_70 = (double)(this->noise_ax * fVar10);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_70);
    local_78 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_78);
    local_80 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_80);
    local_88 = (double)(fVar11 * this->noise_ay);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_88);
    local_90 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar6,&local_90);
    local_98 = (double)(fVar10 * this->noise_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&local_98);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_d0)
    ;
    KalmanFilter::Predict(&this->ekf_);
    pMVar1 = &(this->ekf_).H_;
    if (measurement_pack->sensor_type_ == RADAR) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pMVar1,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_radar_);
      other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_;
    }
    else {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pMVar1,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
      other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,other);
    KalmanFilter::Update(&this->ekf_,&measurement_pack->raw_measurements_);
    return;
  }
  pdVar7 = (double *)Eigen::internal::aligned_malloc(0x20);
  pVVar2 = &(this->ekf_).x_;
  __ptr_00 = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
  (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       pdVar7;
  (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       4;
  free(__ptr_00);
  local_d0.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar2;
  if (measurement_pack->sensor_type_ == LASER) {
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &measurement_pack->raw_measurements_,0);
    local_d0.m_row = 0;
    local_d0.m_col = 1;
    local_d0.m_currentBlockRows = 1;
    *(pVVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         *pdVar8;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &measurement_pack->raw_measurements_,1);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0,
                        pdVar8);
    local_a8 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar9,&local_a8);
    local_b0 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar9,&local_b0);
  }
  else {
    if (measurement_pack->sensor_type_ != RADAR) goto LAB_00103386;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &measurement_pack->raw_measurements_,0);
    local_d0.m_row = 0;
    local_d0.m_col = 1;
    local_d0.m_currentBlockRows = 1;
    *(pVVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         *pdVar8;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &measurement_pack->raw_measurements_,1);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0,
                        pdVar8);
    local_a8 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar9,&local_a8);
    local_b0 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar9,&local_b0);
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_d0);
LAB_00103386:
  this->previous_timestamp_ = measurement_pack->timestamp_;
  this->is_initialized_ = true;
  return;
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {


  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {

    // first measurement
   // cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      /**
          Initialize state. cheked
      */

       ekf_.x_ << measurement_pack.raw_measurements_[0], measurement_pack.raw_measurements_[1], 0, 0; // x, y, vx, vy
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      /**
      Initialize state.cheked
      */
      ekf_.x_ << measurement_pack.raw_measurements_[0], measurement_pack.raw_measurements_[1], 0, 0; // x, y, vx, vy
    }


    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction (laser)
   ****************************************************************************/

  /**
     * Update the state transition matrix F according to the new elapsed time.
      - Time is measured in seconds.
     * Update the process noise covariance matrix.
     * Use noise_ax = 9 and noise_ay = 9 for your Q matrix.
   */

  // compute the time elapsed between the current and previous measurements (0.05 seconds)
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;  //  in seconds
  previous_timestamp_ = measurement_pack.timestamp_;

// time difference is 0.05 seconds

//dt power of 4, 3,2 need for Q matrix cheked

  float dt_2 = dt * dt;
  float dt_3 = dt_2 * dt;
  float dt_4 = dt_3 * dt;

  // Modify the F matrix so that the time is integrated
  ekf_.F_(0, 2) = dt;
  ekf_.F_(1, 3) = dt;

  //set the process covariance matrix Q  cheked
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ << dt_4/4*noise_ax,   0,                dt_3/2*noise_ax,  0,
             0,                 dt_4/4*noise_ay,  0,                dt_3/2*noise_ay,
             dt_3/2*noise_ax,   0,                dt_2*noise_ax,    0,
             0,                 dt_3/2*noise_ay,  0,                dt_2*noise_ay;

  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  /**
     * Use the sensor type to perform the update step.
     * Update the state and covariance matrices.
   */

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    // Radar updates  cheked
    ekf_.H_ = H_radar_;
    ekf_.R_ = R_radar_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }
  else {
    // Laser updates  cheked
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }

  // print the output
 // cout << "x_ = " << ekf_.x_ << endl;
 // cout << "P_ = " << ekf_.P_ << endl;
}